

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglNativeCoordMappingTests.cpp
# Opt level: O1

bool deqp::egl::anon_unknown_0::validate
               (TestLog *log,TextureLevel *result,int rectX,int rectY,int rectW,int rectH)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  TestLog *pTVar5;
  bool bVar6;
  long lVar7;
  ConstPixelBufferAccess *pCVar8;
  void *__buf;
  void *__buf_00;
  bool bVar9;
  int z;
  int y;
  Surface errorMask;
  Vec4 white;
  Vec4 resultColor;
  Vec4 black;
  Surface local_188;
  int local_16c;
  int local_168;
  int local_164;
  string local_160;
  string local_140;
  TestLog *local_120;
  ulong local_118;
  TextureFormat local_110;
  undefined1 *local_108;
  undefined1 *puStack_100;
  ConstPixelBufferAccess local_f8;
  Vec4 local_d0;
  LogImage local_c0;
  
  local_d0.m_data[0] = 0.0;
  local_d0.m_data[1] = 0.0;
  local_d0.m_data[2] = 0.0;
  local_d0.m_data[3] = 1.0;
  local_108 = &DAT_3f8000003f800000;
  puStack_100 = &DAT_3f8000003f800000;
  local_120 = log;
  tcu::Surface::Surface(&local_188,(result->m_size).m_data[0],(result->m_size).m_data[1]);
  if ((result->m_size).m_data[1] < 1) {
    bVar9 = true;
  }
  else {
    local_164 = rectX + 0x47;
    local_16c = rectX + -1;
    local_168 = rectX + 0x48;
    bVar9 = true;
    z = 0;
    local_118 = (ulong)(uint)rectX;
    do {
      if (0 < (result->m_size).m_data[0]) {
        y = 0;
        do {
          tcu::TextureLevel::getAccess((ConstPixelBufferAccess *)&local_c0,result);
          tcu::ConstPixelBufferAccess::getPixel(&local_f8,(int)&local_c0,y,z);
          if (((z < local_164) && ((int)local_118 < z)) && (y - 9U < 0x3e)) {
            bVar6 = compareColor((Vec4 *)&local_f8,(Vec4 *)&local_108);
LAB_00e49761:
            lVar7 = (long)(y + local_188.m_width * z);
            if (bVar6 == false) {
              *(undefined4 *)((long)local_188.m_pixels.m_ptr + lVar7 * 4) = 0xff0000ff;
LAB_00e497e1:
              bVar9 = false;
            }
            else {
              *(undefined4 *)((long)local_188.m_pixels.m_ptr + lVar7 * 4) = 0xff00ff00;
            }
          }
          else {
            bVar6 = compareColor((Vec4 *)&local_f8,&local_d0);
            if (((local_168 < z) || (z < local_16c)) || (y - 0x49U < 0xffffffbe)) goto LAB_00e49761;
            if ((!bVar6) && (bVar6 = compareColor((Vec4 *)&local_f8,(Vec4 *)&local_108), !bVar6)) {
              *(undefined4 *)
               ((long)local_188.m_pixels.m_ptr + (long)(y + local_188.m_width * z) * 4) = 0xff0000ff
              ;
              goto LAB_00e497e1;
            }
            *(undefined4 *)((long)local_188.m_pixels.m_ptr + (long)(y + local_188.m_width * z) * 4)
                 = 0xff00ff00;
          }
          y = y + 1;
        } while (y < (result->m_size).m_data[0]);
      }
      z = z + 1;
    } while (z < (result->m_size).m_data[1]);
  }
  paVar1 = &local_140.field_2;
  local_140._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"Result","");
  paVar2 = &local_160.field_2;
  local_160._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"Result of rendering","");
  pTVar5 = local_120;
  tcu::TextureLevel::getAccess(&local_f8,result);
  pCVar8 = &local_f8;
  tcu::LogImage::LogImage(&local_c0,&local_140,&local_160,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::LogImage::write(&local_c0,(int)pTVar5,__buf,(size_t)pCVar8);
  paVar3 = &local_c0.m_description.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_description._M_dataplus._M_p != paVar3) {
    operator_delete(local_c0.m_description._M_dataplus._M_p,
                    local_c0.m_description.field_2._M_allocated_capacity + 1);
  }
  paVar4 = &local_c0.m_name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0.m_name._M_dataplus._M_p != paVar4) {
    operator_delete(local_c0.m_name._M_dataplus._M_p,
                    local_c0.m_name.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_160._M_dataplus._M_p != paVar2) {
    operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_140._M_dataplus._M_p != paVar1) {
    operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    local_140._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_140,"Error Mask","");
    local_160._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_160,"Error Mask","");
    local_110.order = RGBA;
    local_110.type = UNORM_INT8;
    if ((void *)local_188.m_pixels.m_cap != (void *)0x0) {
      local_188.m_pixels.m_cap = (size_t)local_188.m_pixels.m_ptr;
    }
    tcu::PixelBufferAccess::PixelBufferAccess
              ((PixelBufferAccess *)&local_f8,&local_110,local_188.m_width,local_188.m_height,1,
               (void *)local_188.m_pixels.m_cap);
    pCVar8 = &local_f8;
    tcu::LogImage::LogImage(&local_c0,&local_140,&local_160,pCVar8,QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::LogImage::write(&local_c0,(int)pTVar5,__buf_00,(size_t)pCVar8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.m_description._M_dataplus._M_p != paVar3) {
      operator_delete(local_c0.m_description._M_dataplus._M_p,
                      local_c0.m_description.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0.m_name._M_dataplus._M_p != paVar4) {
      operator_delete(local_c0.m_name._M_dataplus._M_p,
                      local_c0.m_name.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_160._M_dataplus._M_p != paVar2) {
      operator_delete(local_160._M_dataplus._M_p,local_160.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_140._M_dataplus._M_p != paVar1) {
      operator_delete(local_140._M_dataplus._M_p,local_140.field_2._M_allocated_capacity + 1);
    }
  }
  tcu::Surface::~Surface(&local_188);
  return bVar9;
}

Assistant:

bool validate (TestLog& log, const tcu::TextureLevel& result, int rectX, int rectY, int rectW, int rectH)
{
	const tcu::Vec4		black		(0.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4		white		(1.0f, 1.0f, 1.0f, 1.0f);
	tcu::Surface		errorMask	(result.getWidth(), result.getHeight());
	bool				isOk		= true;

	for (int y = 0; y < result.getHeight(); y++)
	{
		for (int x = 0; x < result.getWidth(); x++)
		{
			const tcu::Vec4 resultColor = result.getAccess().getPixel(x, y);

			if (x > rectX && x < rectX + rectW - 1 && y > rectY && y < rectY + rectH - 1)
			{
				if (!compareColor(resultColor, white))
				{
					errorMask.setPixel(x, y, tcu::RGBA(255, 0, 0, 255));
					isOk = false;
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA(0, 255, 0, 255));
			}
			else if (x < rectX-1 || x > rectX + rectW || y < rectY-1 || y > rectY + rectH)
			{
				if (!compareColor(resultColor, black))
				{
					errorMask.setPixel(x, y, tcu::RGBA(255, 0, 0, 255));
					isOk = false;
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA(0, 255, 0, 255));
			}
			else
			{
				// Pixel is close to edge of reference rectangle

				if (!compareColor(resultColor, black) && !compareColor(resultColor, white))
				{
					errorMask.setPixel(x, y, tcu::RGBA(255, 0, 0, 255));
					isOk = false;
				}
				else
					errorMask.setPixel(x, y, tcu::RGBA(0, 255, 0, 255));
			}
		}
	}

	log << TestLog::Image("Result", "Result of rendering", result.getAccess());

	if (!isOk)
		log << TestLog::Image("Error Mask", "Error Mask", errorMask.getAccess());

	return isOk;
}